

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  bool bVar1;
  CppType CVar2;
  uint uVar3;
  Descriptor *this_00;
  MessageOptions *this_01;
  reference ppMVar4;
  reference ppMVar5;
  value_type local_f0;
  value_type local_e0;
  uint local_c0;
  Message *message_to_delete;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *__range3;
  value_type local_80;
  Message *sub_message;
  FastFieldValuePrinter *printer;
  uint local_68;
  int field_index;
  int j;
  byte local_52;
  byte local_51;
  undefined1 local_50 [6];
  bool is_map;
  bool need_release;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  int count;
  TextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  if (((((this->use_short_repeated_primitives_ & 1U) != 0) &&
       (bVar1 = FieldDescriptor::is_repeated(field), bVar1)) &&
      (CVar2 = FieldDescriptor::cpp_type(field), CVar2 != CPPTYPE_STRING)) &&
     (CVar2 = FieldDescriptor::cpp_type(field), CVar2 != CPPTYPE_MESSAGE)) {
    PrintShortRepeatedField(this,message,reflection,field,generator);
    return;
  }
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    sorted_map_field.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar1 = Reflection::HasField(reflection,message,field);
    if (!bVar1) {
      this_00 = FieldDescriptor::containing_type(field);
      this_01 = Descriptor::options(this_00);
      bVar1 = MessageOptions::map_entry(this_01);
      if (!bVar1) goto LAB_0071da15;
    }
    sorted_map_field.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
LAB_0071da15:
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)local_50);
  local_51 = 0;
  local_52 = FieldDescriptor::is_map(field);
  if ((bool)local_52) {
    local_51 = internal::MapFieldPrinterHelper::SortMap
                         (message,reflection,field,
                          (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           *)local_50);
  }
  for (local_68 = 0;
      (int)local_68 <
      (int)sorted_map_field.
           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_68 = local_68 + 1) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      local_c0 = local_68;
    }
    else {
      local_c0 = 0xffffffff;
    }
    printer._4_4_ = local_c0;
    PrintFieldName(this,message,local_c0,
                   sorted_map_field.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,reflection,field,
                   generator);
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_MESSAGE) {
      sub_message = (Message *)GetFieldPrinter(this,field);
      bVar1 = FieldDescriptor::is_repeated(field);
      if (bVar1) {
        if ((local_52 & 1) == 0) {
          local_e0 = Reflection::GetRepeatedMessage(reflection,message,field,local_68);
        }
        else {
          ppMVar4 = std::
                    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    ::operator[]((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                  *)local_50,(long)(int)local_68);
          local_e0 = *ppMVar4;
        }
        local_f0 = local_e0;
      }
      else {
        local_f0 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
      }
      local_80 = local_f0;
      (*(sub_message->super_MessageLite)._vptr_MessageLite[0xe])
                (sub_message,local_f0,(ulong)printer._4_4_,
                 (ulong)sorted_map_field.
                        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                 (ulong)(this->single_line_mode_ & 1),generator);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])();
      uVar3 = (*(sub_message->super_MessageLite)._vptr_MessageLite[0xf])
                        (sub_message,local_80,(ulong)printer._4_4_,
                         (ulong)sorted_map_field.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         (ulong)(this->single_line_mode_ & 1),generator);
      if ((uVar3 & 1) == 0) {
        Print(this,local_80,generator);
      }
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])();
      (*(sub_message->super_MessageLite)._vptr_MessageLite[0x10])
                (sub_message,local_80,(ulong)printer._4_4_,
                 (ulong)sorted_map_field.
                        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                 (ulong)(this->single_line_mode_ & 1),generator);
    }
    else {
      stringpiece_internal::StringPiece::StringPiece((StringPiece *)&__range3,": ");
      TextGenerator::PrintMaybeWithMarker(generator,___range3);
      PrintFieldValue(this,message,reflection,field,printer._4_4_,generator);
      if ((this->single_line_mode_ & 1U) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x774153);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x7d13d3);
      }
    }
  }
  if ((local_51 & 1) != 0) {
    __end3 = std::
             vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             ::begin((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      *)local_50);
    message_to_delete =
         (Message *)
         std::
         vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
         ::end((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_50);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
                                       *)&message_to_delete), bVar1) {
      ppMVar5 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
                ::operator*(&__end3);
      if (*ppMVar5 != (Message *)0x0) {
        (*((*ppMVar5)->super_MessageLite)._vptr_MessageLite[1])();
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
      ::operator++(&__end3);
    }
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_50);
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      if (!printer->PrintMessageContent(sub_message, field_index, count,
                                        single_line_mode_, generator)) {
        Print(sub_message, generator);
      }
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintMaybeWithMarker(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (const Message* message_to_delete : sorted_map_field) {
      delete message_to_delete;
    }
  }
}